

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void display_feature(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  wchar_t wVar1;
  wchar_t wVar2;
  feature *pfVar3;
  uint8_t attr;
  feature *feat;
  wchar_t oid_local;
  _Bool cursor_local;
  wchar_t row_local;
  wchar_t col_local;
  
  pfVar3 = f_info + oid;
  c_prt(curs_attrs[1][(int)(uint)cursor],pfVar3->name,row,col);
  if (tile_height == '\x01') {
    wVar1 = big_pad(L'A',row,feat_x_attr[3][pfVar3->fidx],feat_x_char[3][pfVar3->fidx]);
    wVar2 = big_pad(wVar1 + L'A',row,feat_x_attr[2][pfVar3->fidx],feat_x_char[2][pfVar3->fidx]);
    wVar2 = wVar2 + wVar1 + L'A';
    wVar1 = big_pad(wVar2,row,feat_x_attr[1][pfVar3->fidx],feat_x_char[1][pfVar3->fidx]);
    big_pad(wVar1 + wVar2,row,feat_x_attr[0][pfVar3->fidx],feat_x_char[0][pfVar3->fidx]);
  }
  return;
}

Assistant:

static void display_feature(int col, int row, bool cursor, int oid )
{
	struct feature *feat = &f_info[oid];
	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];

	c_prt(attr, feat->name, row, col);

	if (tile_height == 1) {
		/* Display symbols */
		col = 65;
		col += big_pad(col, row, feat_x_attr[LIGHTING_DARK][feat->fidx],
					   feat_x_char[LIGHTING_DARK][feat->fidx]);
		col += big_pad(col, row, feat_x_attr[LIGHTING_LIT][feat->fidx],
					   feat_x_char[LIGHTING_LIT][feat->fidx]);
		col += big_pad(col, row, feat_x_attr[LIGHTING_TORCH][feat->fidx],
					   feat_x_char[LIGHTING_TORCH][feat->fidx]);
		(void) big_pad(col, row, feat_x_attr[LIGHTING_LOS][feat->fidx],
					   feat_x_char[LIGHTING_LOS][feat->fidx]);
	}
}